

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O1

void greet_prog_tower_shopkeeper(CHAR_DATA *mob,CHAR_DATA *ch)

{
  bool bVar1;
  AFFECT_DATA af;
  CHAR_DATA *local_108;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  AFFECT_DATA local_80;
  
  local_108 = mob;
  bVar1 = is_affected(mob,(int)gsn_bash);
  if (!bVar1) {
    bVar1 = is_npc(ch);
    if (!bVar1) {
      init_affect(&local_80);
      local_80.where = 0;
      local_80.type = gsn_bash;
      local_80.duration = -1;
      affect_to_char(local_108,&local_80);
      act("$N glances over his shoulder at $n and grumbles.",ch,(void *)0x0,local_108,0);
      act("$n glances over his shoulder at you and grumbles.",local_108,(void *)0x0,ch,2);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"greet_prog_tower_shopkeeper","");
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"do_say_queue","");
      CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[90]>
                (&RS.Queue,4,&local_a0,&local_e0,do_say_queue,&local_108,
                 (char (*) [90])
                 "Well,  are ye goin\' to buy somethin\' or are ye just going t\'stand there and stare at me!?"
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"greet_prog_tower_shopkeeper","");
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"do_astrip_queue","");
      CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[1]>
                (&RS.Queue,0x18,&local_c0,&local_100,do_astrip_queue,&local_108,
                 (char (*) [1])0x3a5dc4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void greet_prog_tower_shopkeeper(CHAR_DATA *mob, CHAR_DATA *ch)
{
	AFFECT_DATA af;

	if (is_affected(mob, gsn_bash))
		return;

	if (is_npc(ch))
		return;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_bash;
	af.duration = -1;

	affect_to_char(mob, &af);

	act("$N glances over his shoulder at $n and grumbles.", ch, 0, mob, TO_ROOM);
	act("$n glances over his shoulder at you and grumbles.", mob, 0, ch, TO_VICT);
	RS.Queue.AddToQueue(4, "greet_prog_tower_shopkeeper", "do_say_queue", do_say_queue, mob, "Well,  are ye goin' to buy somethin' or are ye just going t'stand there and stare at me!?");
	RS.Queue.AddToQueue(24, "greet_prog_tower_shopkeeper", "do_astrip_queue", do_astrip_queue, mob, "");
}